

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

nng_err nni_aio_alloc(nni_aio **aio_p,nni_cb cb,void *arg)

{
  nni_aio *aio_00;
  nni_aio *aio;
  void *arg_local;
  nni_cb cb_local;
  nni_aio **aio_p_local;
  
  aio_00 = (nni_aio *)nni_zalloc(0x1c8);
  if (aio_00 == (nni_aio *)0x0) {
    aio_p_local._4_4_ = NNG_ENOMEM;
  }
  else {
    nni_aio_init(aio_00,cb,arg);
    *aio_p = aio_00;
    aio_p_local._4_4_ = NNG_OK;
  }
  return aio_p_local._4_4_;
}

Assistant:

nng_err
nni_aio_alloc(nni_aio **aio_p, nni_cb cb, void *arg)
{
	nni_aio *aio;

	if ((aio = NNI_ALLOC_STRUCT(aio)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_aio_init(aio, cb, arg);
	*aio_p = aio;
	return (NNG_OK);
}